

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O3

void test_all_maps<HashObject<8,8>>(int obj_size,int iters)

{
  float fVar1;
  _Hash_node_base *p_Var2;
  iterator iVar3;
  iterator iVar4;
  type tVar5;
  uint uVar6;
  long lVar7;
  value_type *pvVar8;
  long lVar9;
  iterator iVar10;
  value_type *pvVar11;
  value_type *pvVar12;
  pointer ppVar13;
  value_type *pvVar14;
  uint *puVar15;
  iterator iVar16;
  type tVar17;
  mapped_type *pmVar18;
  type tVar19;
  iterator iVar20;
  undefined8 uVar21;
  pointer psVar22;
  pointer end_memory;
  uchar *puVar23;
  size_t start_memory;
  size_t start_memory_00;
  pointer psVar24;
  size_t start_memory_01;
  size_t start_memory_02;
  size_t start_memory_03;
  size_t start_memory_04;
  pointer psVar25;
  size_t start_memory_05;
  size_t start_memory_06;
  ulong uVar26;
  key_type kVar27;
  key_type kVar28;
  int iVar29;
  type tVar30;
  type tVar31;
  type tVar32;
  uint uVar33;
  uint uVar34;
  int iVar35;
  bool bVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_HashObject<8,_8>,_int>_>,_std::_Rb_tree_iterator<std::pair<const_HashObject<8,_8>,_int>_>_>
  pVar55;
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> set;
  uint local_164;
  undefined1 local_160 [16];
  type local_150;
  type tStack_148;
  type local_140;
  type local_138;
  vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
  vStack_130;
  pointer local_110;
  undefined1 local_108 [8];
  iterator iStack_100;
  iterator local_f8;
  iterator iStack_f0;
  pointer local_e8;
  iterator iStack_e0;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  nonempty_iterator local_c8;
  uint local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  size_type local_b0;
  double local_a8;
  int local_a0;
  libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_> local_9a;
  equal_to<HashObject<8,_8>_*> local_99;
  ulong local_98;
  long local_90;
  ulong local_88;
  HashObject<8,_8> local_80;
  undefined1 local_78 [8];
  iterator iStack_70;
  iterator local_68;
  iterator iStack_60;
  pointer local_58;
  iterator iStack_50;
  iterator local_48;
  iterator iStack_40;
  nonempty_iterator local_38;
  
  psVar25 = (pointer)(ulong)(uint)obj_size;
  iVar20._M_current =
       (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        *)psVar25;
  printf("\n%s (%d byte objects, %d iterations):\n","SPARSE_HASH_MAP",8);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      pvVar8 = google::
               sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                           *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
      pvVar8->second = uVar34;
    } while (obj_size != uVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,(size_t)iVar20._M_current
        );
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
             *)&vStack_130);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  local_b0 = (size_type)obj_size;
  google::
  sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::resize((sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)local_160,local_b0);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      pvVar8 = google::
               sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                           *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
      pvVar8->second = uVar34;
    } while (obj_size != uVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,
         (size_t)iVar20._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
             *)&vStack_130);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
  }
  else {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      pvVar8 = google::
               sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                           *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
      pvVar8->second = uVar34;
    } while (obj_size != uVar34);
    uVar34 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      pvVar8 = google::
               sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                           *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
      pvVar8->second = uVar34;
    } while (obj_size != uVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,
         (size_t)iVar20._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
             *)&vStack_130);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_160,local_b0,(allocator_type *)local_108);
  auVar54 = _DAT_0013b020;
  if (0 < obj_size) {
    iVar20._M_current =
         (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
          *)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar23 = psVar25[-1].bitmap + 5;
    auVar38._8_4_ = (int)puVar23;
    auVar38._0_8_ = puVar23;
    auVar38._12_4_ = (int)((ulong)puVar23 >> 0x20);
    psVar22 = (pointer)0x0;
    auVar38 = auVar38 ^ _DAT_0013b020;
    auVar53 = _DAT_0013b010;
    do {
      auVar52 = auVar53 ^ auVar54;
      if ((bool)(~(auVar38._4_4_ < auVar52._4_4_ ||
                  auVar38._0_4_ < auVar52._0_4_ && auVar52._4_4_ == auVar38._4_4_) & 1)) {
        *(int *)(local_160._0_8_ + (long)psVar22 * 4) = (int)psVar22;
      }
      if (auVar52._12_4_ <= auVar38._12_4_ &&
          (auVar52._8_4_ <= auVar38._8_4_ || auVar52._12_4_ != auVar38._12_4_)) {
        *(int *)(local_160._0_8_ + (long)psVar22 * 4 + 4) = (int)psVar22 + 1;
      }
      psVar22 = (pointer)((long)&psVar22->group + 2);
      lVar7 = auVar53._8_8_;
      auVar53._0_8_ = auVar53._0_8_ + 2;
      auVar53._8_8_ = lVar7 + 2;
    } while ((pointer)iVar20._M_current != psVar22);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_160);
  time_map_fetch<EasyUseSparseHashMap<HashObject<8,8>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_160,"map_fetch_random");
  if ((__buckets_ptr)local_160._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_160._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_160,local_b0,(allocator_type *)local_108);
  auVar54 = _DAT_0013b020;
  if (0 < obj_size) {
    iVar20._M_current =
         (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
          *)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar23 = psVar25[-1].bitmap + 5;
    auVar39._8_4_ = (int)puVar23;
    auVar39._0_8_ = puVar23;
    auVar39._12_4_ = (int)((ulong)puVar23 >> 0x20);
    psVar22 = (pointer)0x0;
    auVar39 = auVar39 ^ _DAT_0013b020;
    auVar52 = _DAT_0013b010;
    do {
      auVar53 = auVar52 ^ auVar54;
      if ((bool)(~(auVar39._4_4_ < auVar53._4_4_ ||
                  auVar39._0_4_ < auVar53._0_4_ && auVar53._4_4_ == auVar39._4_4_) & 1)) {
        *(int *)(local_160._0_8_ + (long)psVar22 * 4) = (int)psVar22;
      }
      if (auVar53._12_4_ <= auVar39._12_4_ &&
          (auVar53._8_4_ <= auVar39._8_4_ || auVar53._12_4_ != auVar39._12_4_)) {
        *(int *)(local_160._0_8_ + (long)psVar22 * 4 + 4) = (int)psVar22 + 1;
      }
      psVar22 = (pointer)((long)&psVar22->group + 2);
      lVar7 = auVar52._8_8_;
      auVar52._0_8_ = auVar52._0_8_ + 2;
      auVar52._8_8_ = lVar7 + 2;
    } while ((pointer)iVar20._M_current != psVar22);
  }
  time_map_fetch<EasyUseSparseHashMap<HashObject<8,8>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_160,"map_fetch_sequential");
  if ((__buckets_ptr)local_160._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_160._0_8_);
  }
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  uVar34 = 1;
  if (0 < obj_size) {
    uVar33 = 0;
    do {
      local_80.buffer_ = (char  [4])((uVar33 & 0xff) * 0x1010101);
      local_80.i_ = uVar33;
      google::
      sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
      ::find<HashObject<8,8>>
                ((iterator *)local_108,
                 (sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                  *)local_160,&local_80);
      iStack_70._M_current =
           (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)vStack_130.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      local_68._M_current =
           (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)vStack_130.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      iStack_60._M_current =
           (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)vStack_130.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      local_58 = (pointer)0x0;
      iStack_50._M_current =
           (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)vStack_130.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      local_48._M_current =
           (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)vStack_130.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      iStack_40._M_current =
           (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)vStack_130.
              super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      local_38 = (nonempty_iterator)0x0;
      local_78 = (undefined1  [8])local_160;
      google::
      sparse_hashtable_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      ::advance_past_deleted
                ((sparse_hashtable_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                  *)local_78);
      uVar6 = 1;
      iVar20._M_current = iStack_100._M_current;
      if (((iStack_100._M_current == iStack_70._M_current) &&
          (iVar20._M_current = local_f8._M_current, local_f8._M_current == local_68._M_current)) &&
         (iStack_f0._M_current == iStack_60._M_current)) {
        if (iStack_f0._M_current == local_f8._M_current) {
          uVar6 = 0;
        }
        else {
          uVar6 = (uint)(local_e8 != local_58);
          iVar20._M_current =
               (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                *)local_e8;
        }
      }
      uVar34 = uVar34 ^ uVar6;
      uVar33 = uVar33 + 1;
    } while (obj_size != uVar33);
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar34);
  report("map_fetch_empty",(double)(lVar9 - lVar7),obj_size,start_memory,(size_t)iVar20._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
             *)&vStack_130);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
  }
  else {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      pvVar8 = google::
               sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                           *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
      pvVar8->second = uVar34;
    } while (obj_size != uVar34);
    uVar34 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      google::
      sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      ::erase((sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
    } while (obj_size != uVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,
         (size_t)iVar20._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
             *)&vStack_130);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      pvVar8 = google::
               sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                           *)local_160,(key_type *)local_108);
      uVar33 = uVar34 + 1;
      pvVar8->second = uVar33;
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      google::
      sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      ::erase((sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_160,(key_type *)local_108);
      uVar34 = uVar33;
    } while (uVar33 != obj_size);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,
         (size_t)iVar20._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
             *)&vStack_130);
  EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      pvVar8 = google::
               sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                           *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
      pvVar8->second = uVar34;
    } while (obj_size != uVar34);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  google::
  sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::begin((iterator *)local_78,
          (sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
           *)local_160);
  local_108 = local_78;
  iStack_100._M_current = iStack_70._M_current;
  local_f8._M_current = local_68._M_current;
  iStack_f0._M_current = iStack_60._M_current;
  local_e8 = local_58;
  iStack_e0._M_current = iStack_50._M_current;
  local_d8 = local_48._M_current._0_4_;
  uStack_d4 = local_48._M_current._4_4_;
  uStack_d0 = iStack_40._M_current._0_4_;
  uStack_cc = iStack_40._M_current._4_4_;
  local_c8 = local_38;
  iStack_70._M_current =
       (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        *)vStack_130.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_68._M_current =
       (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        *)vStack_130.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  iStack_60._M_current =
       (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        *)vStack_130.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = (pointer)0x0;
  iStack_50._M_current =
       (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        *)vStack_130.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_48._M_current =
       (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        *)vStack_130.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  iStack_40._M_current =
       (sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        *)vStack_130.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = (nonempty_iterator)0x0;
  local_78 = (undefined1  [8])local_160;
  google::
  sparse_hashtable_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::advance_past_deleted
            ((sparse_hashtable_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
              *)local_78);
  psVar22 = local_58;
  iVar4._M_current = iStack_60._M_current;
  iVar3._M_current = local_68._M_current;
  iVar20._M_current = iStack_70._M_current;
  uVar34 = 1;
  do {
    if (iStack_100._M_current == iVar20._M_current) {
      if (((local_f8._M_current == iVar3._M_current) && (iStack_f0._M_current == iVar4._M_current))
         && (iVar4._M_current == iVar3._M_current || local_e8 == psVar22)) break;
    }
    uVar34 = uVar34 ^ *(uint *)&local_e8->settings;
    local_e8 = (pointer)(local_e8->bitmap + 2);
    iVar10._M_current = iStack_f0._M_current;
    if (local_e8 ==
        (pointer)(((HashObject<8,_8> *)&((pointer)(iStack_f0._M_current)->group)->first)->buffer_ +
                 ((ulong)((uint)((iStack_f0._M_current)->settings).num_buckets * 0xc) - 4))) {
      do {
        iVar10._M_current = iStack_f0._M_current + 1;
        if (iVar10._M_current == local_f8._M_current) break;
        local_e8 = (pointer)((pointer)iVar10._M_current)->group;
        psVar24 = (pointer)iStack_f0._M_current + 1;
        iStack_f0._M_current = iVar10._M_current;
      } while (((Settings *)&psVar24->settings)->num_buckets == 0);
    }
    iStack_f0._M_current = iVar10._M_current;
    google::
    sparse_hashtable_const_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::advance_past_deleted
              ((sparse_hashtable_const_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                *)local_108);
  } while( true );
  psVar22 = local_e8;
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar34);
  report("map_iterate",(double)(lVar9 - lVar7),obj_size,start_memory_00,(size_t)psVar22);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
             *)&vStack_130);
  putchar(10);
  local_a0 = obj_size + 3;
  if (-1 < obj_size) {
    local_a0 = obj_size;
  }
  local_a0 = local_a0 >> 2;
  uVar21 = CONCAT71((int7)((ulong)psVar22 >> 8),1);
  lVar7 = 0;
  do {
    local_c0 = (uint)uVar21;
    uVar26 = (ulong)(int)(&stresshashfunction<EasyUseHashMap<HashObject<8,8>*,int,HashFn>>(int)::
                           kMapSizes)[lVar7];
    local_164 = 1;
    local_98 = uVar26;
    do {
      g_num_copies = 0;
      g_num_hashes = 0;
      std::chrono::_V2::steady_clock::now();
      iVar29 = local_a0 / (int)uVar26;
      google::
      sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
      ::sparse_hashtable((sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                          *)local_160,0,(HashFn *)&local_80,&local_99,(SelectKey *)local_108,
                         (SetKey *)local_78,&local_9a);
      dVar37 = NAN;
      local_bc = iVar29;
      if (0 < iVar29) {
        local_a8 = 0.0;
        iVar29 = 0;
        iVar35 = 0;
        do {
          google::
          sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
          ::clear((sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                   *)local_160);
          google::
          sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
          ::resize((sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                    *)local_160,uVar26);
          g_num_copies = 0;
          g_num_hashes = 0;
          local_b8 = iVar35;
          local_90 = std::chrono::_V2::steady_clock::now();
          uVar34 = (int)uVar26 >> 0x1f;
          iVar35 = (int)((long)((ulong)uVar34 << 0x20 | uVar26 & 0xffffffff) /
                        (long)(int)(0x7fffffff / (long)(int)local_164));
          if (-1 < iVar35) {
            uVar33 = iVar35 + 1;
            local_88 = (ulong)uVar33;
            local_b4 = (int)((long)((ulong)uVar34 << 0x20 | uVar26 & 0xffffffff) / (long)(int)uVar33
                            );
            uVar26 = 0;
            kVar28 = (key_type)(long)(int)local_164;
            do {
              kVar27 = kVar28;
              iVar35 = local_b4;
              if (0 < local_b4) {
                do {
                  local_108 = (undefined1  [8])kVar27;
                  pvVar11 = google::
                            sparse_hashtable<std::pair<HashObject<8,8>*const,int>,HashObject<8,8>*,HashFn,google::sparse_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SetKey,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>
                            ::
                            find_or_insert<google::sparse_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::DefaultValue>
                                      ((sparse_hashtable<std::pair<HashObject<8,8>*const,int>,HashObject<8,8>*,HashFn,google::sparse_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SetKey,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>
                                        *)local_160,(key_type *)local_108);
                  iVar29 = iVar29 + 1;
                  pvVar11->second = iVar29;
                  kVar27 = (key_type)((long)kVar27 + (long)(int)local_164);
                  iVar35 = iVar35 + -1;
                } while (iVar35 != 0);
              }
              uVar26 = uVar26 + 1;
              kVar28 = (key_type)((long)kVar28 + 1);
            } while (uVar26 != local_88);
          }
          lVar7 = std::chrono::_V2::steady_clock::now();
          local_a8 = local_a8 + (double)(lVar7 - local_90);
          iVar35 = local_b8 + 1;
          uVar26 = local_98;
        } while (iVar35 != local_bc);
        dVar37 = local_a8 / (double)iVar29;
      }
      printf("stresshashfunction map_size=%d stride=%d: %.1fns/insertion\n",dVar37,
             uVar26 & 0xffffffff,(ulong)local_164);
      std::
      vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
      ::~vector(&vStack_130);
      local_164 = local_164 * (int)uVar26;
    } while ((int)local_164 <= (int)uVar26);
    lVar7 = 1;
    uVar21 = 0;
  } while ((local_c0 & 1) != 0);
  psVar22 = psVar25;
  printf("\n%s (%d byte objects, %d iterations):\n","DENSE_HASH_MAP",8);
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                ::find_or_insert<int,HashObject<8,8>>
                          ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                            *)local_160,(HashObject<8,_8> *)local_108);
      uVar34 = uVar34 + 1;
      pvVar12->second = uVar34;
    } while (obj_size != uVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,(size_t)psVar22);
  if (local_110 != (pointer)0x0) {
    free(local_110);
  }
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  google::
  dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::resize((dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)local_160,local_b0);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                ::find_or_insert<int,HashObject<8,8>>
                          ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                            *)local_160,(HashObject<8,_8> *)local_108);
      uVar34 = uVar34 + 1;
      pvVar12->second = uVar34;
    } while (obj_size != uVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,(size_t)psVar22);
  if (local_110 != (pointer)0x0) {
    free(local_110);
  }
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_160);
  uVar34 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
  }
  else {
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                ::find_or_insert<int,HashObject<8,8>>
                          ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                            *)local_160,(HashObject<8,_8> *)local_108);
      uVar34 = uVar34 + 1;
      pvVar12->second = uVar34;
    } while (obj_size != uVar34);
    uVar34 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                ::find_or_insert<int,HashObject<8,8>>
                          ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                            *)local_160,(HashObject<8,_8> *)local_108);
      uVar34 = uVar34 + 1;
      pvVar12->second = uVar34;
    } while (obj_size != uVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,(size_t)psVar22);
  if (local_110 != (pointer)0x0) {
    free(local_110);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_160,local_b0,(allocator_type *)local_108);
  auVar54 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar23 = psVar25[-1].bitmap + 5;
    auVar40._8_4_ = (int)puVar23;
    auVar40._0_8_ = puVar23;
    auVar40._12_4_ = (int)((ulong)puVar23 >> 0x20);
    psVar24 = (pointer)0x0;
    auVar40 = auVar40 ^ _DAT_0013b020;
    auVar46 = _DAT_0013b010;
    do {
      auVar53 = auVar46 ^ auVar54;
      if ((bool)(~(auVar40._4_4_ < auVar53._4_4_ ||
                  auVar40._0_4_ < auVar53._0_4_ && auVar53._4_4_ == auVar40._4_4_) & 1)) {
        *(int *)(local_160._0_8_ + (long)psVar24 * 4) = (int)psVar24;
      }
      if (auVar53._12_4_ <= auVar40._12_4_ &&
          (auVar53._8_4_ <= auVar40._8_4_ || auVar53._12_4_ != auVar40._12_4_)) {
        *(int *)(local_160._0_8_ + (long)psVar24 * 4 + 4) = (int)psVar24 + 1;
      }
      psVar24 = (pointer)((long)&psVar24->group + 2);
      lVar7 = auVar46._8_8_;
      auVar46._0_8_ = auVar46._0_8_ + 2;
      auVar46._8_8_ = lVar7 + 2;
    } while (psVar22 != psVar24);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_160);
  time_map_fetch<EasyUseDenseHashMap<HashObject<8,8>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_160,"map_fetch_random");
  if ((__buckets_ptr)local_160._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_160._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_160,local_b0,(allocator_type *)local_108);
  auVar54 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar23 = psVar25[-1].bitmap + 5;
    auVar41._8_4_ = (int)puVar23;
    auVar41._0_8_ = puVar23;
    auVar41._12_4_ = (int)((ulong)puVar23 >> 0x20);
    psVar24 = (pointer)0x0;
    auVar41 = auVar41 ^ _DAT_0013b020;
    auVar47 = _DAT_0013b010;
    do {
      auVar53 = auVar47 ^ auVar54;
      if ((bool)(~(auVar41._4_4_ < auVar53._4_4_ ||
                  auVar41._0_4_ < auVar53._0_4_ && auVar53._4_4_ == auVar41._4_4_) & 1)) {
        *(int *)(local_160._0_8_ + (long)psVar24 * 4) = (int)psVar24;
      }
      if (auVar53._12_4_ <= auVar41._12_4_ &&
          (auVar53._8_4_ <= auVar41._8_4_ || auVar53._12_4_ != auVar41._12_4_)) {
        *(int *)(local_160._0_8_ + (long)psVar24 * 4 + 4) = (int)psVar24 + 1;
      }
      psVar24 = (pointer)((long)&psVar24->group + 2);
      lVar7 = auVar47._8_8_;
      auVar47._0_8_ = auVar47._0_8_ + 2;
      auVar47._8_8_ = lVar7 + 2;
    } while (psVar22 != psVar24);
  }
  time_map_fetch<EasyUseDenseHashMap<HashObject<8,8>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_160,"map_fetch_sequential");
  if ((__buckets_ptr)local_160._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_160._0_8_);
  }
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_160);
  uVar33 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  uVar34 = 1;
  if (0 < obj_size) {
    do {
      local_78._4_4_ = (uVar33 & 0xff) * 0x1010101;
      local_78._0_4_ = uVar33;
      google::
      dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
      ::find<HashObject<8,8>>
                ((iterator *)local_108,
                 (dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                  *)local_160,(HashObject<8,_8> *)local_78);
      bVar36 = (pointer)iStack_100._M_current !=
               (pointer)((long)&local_110->first +
                        (long)vStack_130.
                              super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage * 0xc);
      psVar22 = (pointer)(ulong)bVar36;
      uVar34 = uVar34 ^ bVar36;
      uVar33 = uVar33 + 1;
    } while (obj_size != uVar33);
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar34);
  report("map_fetch_empty",(double)(lVar9 - lVar7),obj_size,start_memory_01,(size_t)psVar22);
  if (local_110 != (pointer)0x0) {
    free(local_110);
  }
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_160);
  uVar34 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
  }
  else {
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                ::find_or_insert<int,HashObject<8,8>>
                          ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                            *)local_160,(HashObject<8,_8> *)local_108);
      uVar34 = uVar34 + 1;
      pvVar12->second = uVar34;
    } while (obj_size != uVar34);
    uVar34 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      google::
      dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      ::erase((dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
    } while (obj_size != uVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,(size_t)psVar22);
  if (local_110 != (pointer)0x0) {
    free(local_110);
  }
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                ::find_or_insert<int,HashObject<8,8>>
                          ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                            *)local_160,(HashObject<8,_8> *)local_108);
      uVar33 = uVar34 + 1;
      pvVar12->second = uVar33;
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      google::
      dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
      ::erase((dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_160,(HashObject<8,_8> *)local_108);
      uVar34 = uVar33;
    } while (uVar33 != obj_size);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,(size_t)psVar22);
  if (local_110 != (pointer)0x0) {
    free(local_110);
  }
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)local_160);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      pvVar12 = google::
                dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                ::find_or_insert<int,HashObject<8,8>>
                          ((dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
                            *)local_160,(HashObject<8,_8> *)local_108);
      uVar34 = uVar34 + 1;
      pvVar12->second = uVar34;
    } while (obj_size != uVar34);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  ppVar13 = local_110;
  if (vStack_130.
      super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
LAB_0011f318:
    end_memory = (pointer)((long)&local_110->first +
                          (long)vStack_130.
                                super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage * 0xc);
    if (ppVar13 != end_memory) {
      uVar34 = 1;
      do {
        uVar34 = uVar34 ^ ppVar13->second;
        do {
          ppVar13 = (pointer)&ppVar13->field_0xc;
          if (ppVar13 == end_memory) goto LAB_0011f36a;
        } while (((float)local_138.i_ == *(float *)ppVar13) ||
                (vStack_130.
                 super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0 &&
                 (float)local_140.i_ == *(float *)ppVar13));
      } while (ppVar13 != end_memory);
      goto LAB_0011f36a;
    }
  }
  else {
    lVar9 = (long)vStack_130.
                  super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage * 0xc;
    do {
      fVar1 = (float)((HashObject<8,_8> *)&ppVar13->first)->i_;
      if (((float)local_138.i_ != fVar1) &&
         (vStack_130.
          super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0 || (float)local_140.i_ != fVar1)
         ) goto LAB_0011f318;
      ppVar13 = (pointer)&ppVar13->field_0xc;
      lVar9 = lVar9 + -0xc;
      end_memory = local_110;
    } while (lVar9 != 0);
  }
  uVar34 = 1;
LAB_0011f36a:
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar34);
  report("map_iterate",(double)(lVar9 - lVar7),obj_size,start_memory_02,(size_t)end_memory);
  if (local_110 != (pointer)0x0) {
    free(local_110);
  }
  putchar(10);
  uVar21 = CONCAT71((int7)((ulong)end_memory >> 8),1);
  lVar7 = 0;
  do {
    local_c0 = (uint)uVar21;
    uVar26 = (ulong)(int)(&stresshashfunction<EasyUseHashMap<HashObject<8,8>*,int,HashFn>>(int)::
                           kMapSizes)[lVar7];
    local_164 = 1;
    local_98 = uVar26;
    do {
      g_num_copies = 0;
      g_num_hashes = 0;
      std::chrono::_V2::steady_clock::now();
      iVar29 = local_a0 / (int)uVar26;
      EasyUseDenseHashMap<HashObject<8,_8>_*,_int,_HashFn>::EasyUseDenseHashMap
                ((EasyUseDenseHashMap<HashObject<8,_8>_*,_int,_HashFn> *)local_160);
      dVar37 = NAN;
      local_bc = iVar29;
      if (0 < iVar29) {
        local_a8 = 0.0;
        iVar35 = 0;
        iVar29 = 0;
        do {
          google::
          dense_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
          ::clear((dense_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                   *)local_160);
          google::
          dense_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
          ::resize((dense_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                    *)local_160,uVar26);
          g_num_copies = 0;
          g_num_hashes = 0;
          local_b8 = iVar29;
          local_90 = std::chrono::_V2::steady_clock::now();
          uVar34 = (int)uVar26 >> 0x1f;
          iVar29 = (int)((long)((ulong)uVar34 << 0x20 | uVar26 & 0xffffffff) /
                        (long)(int)(0x7fffffff / (long)(int)local_164));
          if (-1 < iVar29) {
            uVar33 = iVar29 + 1;
            local_88 = (ulong)uVar33;
            local_b4 = (int)((long)((ulong)uVar34 << 0x20 | uVar26 & 0xffffffff) / (long)(int)uVar33
                            );
            uVar26 = 0;
            kVar28 = (key_type)(long)(int)local_164;
            do {
              kVar27 = kVar28;
              iVar29 = local_b4;
              if (0 < local_b4) {
                do {
                  local_108 = (undefined1  [8])kVar27;
                  pvVar14 = google::
                            dense_hashtable<std::pair<HashObject<8,8>*const,int>,HashObject<8,8>*,HashFn,google::dense_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SetKey,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>
                            ::find_or_insert<int,HashObject<8,8>*>
                                      ((dense_hashtable<std::pair<HashObject<8,8>*const,int>,HashObject<8,8>*,HashFn,google::dense_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SetKey,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>
                                        *)local_160,(HashObject<8,_8> **)local_108);
                  iVar35 = iVar35 + 1;
                  pvVar14->second = iVar35;
                  kVar27 = (key_type)((long)kVar27 + (long)(int)local_164);
                  iVar29 = iVar29 + -1;
                } while (iVar29 != 0);
              }
              uVar26 = uVar26 + 1;
              kVar28 = (key_type)((long)kVar28 + 1);
            } while (uVar26 != local_88);
          }
          lVar7 = std::chrono::_V2::steady_clock::now();
          local_a8 = local_a8 + (double)(lVar7 - local_90);
          iVar29 = local_b8 + 1;
          uVar26 = local_98;
        } while (iVar29 != local_bc);
        dVar37 = local_a8 / (double)iVar35;
      }
      printf("stresshashfunction map_size=%d stride=%d: %.1fns/insertion\n",dVar37,
             uVar26 & 0xffffffff,(ulong)local_164);
      if (local_110 != (pointer)0x0) {
        free(local_110);
      }
      local_164 = local_164 * (int)uVar26;
    } while ((int)local_164 <= (int)uVar26);
    lVar7 = 1;
    uVar21 = 0;
  } while ((local_c0 & 1) != 0);
  psVar22 = psVar25;
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD HASH_MAP",8);
  local_160._0_8_ = &vStack_130;
  local_160._8_8_ = (pointer)0x1;
  local_150 = (type)0x0;
  tStack_148 = (type)0x0;
  local_140.i_ = 0x3f800000;
  local_138.i_ = 0;
  local_138.buffer_[0] = '\0';
  local_138.buffer_[1] = '\0';
  local_138.buffer_[2] = '\0';
  local_138.buffer_[3] = '\0';
  vStack_130.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      puVar15 = (uint *)std::__detail::
                        _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
      *puVar15 = uVar34;
    } while (obj_size != uVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_160);
  local_160._0_8_ = &vStack_130;
  local_160._8_8_ = (pointer)0x1;
  local_150 = (type)0x0;
  tStack_148 = (type)0x0;
  local_140.i_ = 0x3f800000;
  local_138.i_ = 0;
  local_138.buffer_[0] = '\0';
  local_138.buffer_[1] = '\0';
  local_138.buffer_[2] = '\0';
  local_138.buffer_[3] = '\0';
  vStack_130.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            *)local_160,local_b0);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      puVar15 = (uint *)std::__detail::
                        _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
      *puVar15 = uVar34;
    } while (obj_size != uVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_160);
  local_160._0_8_ = &vStack_130;
  local_160._8_8_ = (pointer)0x1;
  local_150 = (type)0x0;
  tStack_148 = (type)0x0;
  local_140.i_ = 0x3f800000;
  local_138.i_ = 0;
  local_138.buffer_[0] = '\0';
  local_138.buffer_[1] = '\0';
  local_138.buffer_[2] = '\0';
  local_138.buffer_[3] = '\0';
  vStack_130.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uVar34 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
  }
  else {
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      puVar15 = (uint *)std::__detail::
                        _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
      *puVar15 = uVar34;
    } while (obj_size != uVar34);
    uVar34 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      puVar15 = (uint *)std::__detail::
                        _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
      *puVar15 = uVar34;
    } while (obj_size != uVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_160);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_160,local_b0,(allocator_type *)local_108);
  auVar54 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar23 = psVar25[-1].bitmap + 5;
    auVar42._8_4_ = (int)puVar23;
    auVar42._0_8_ = puVar23;
    auVar42._12_4_ = (int)((ulong)puVar23 >> 0x20);
    psVar24 = (pointer)0x0;
    auVar42 = auVar42 ^ _DAT_0013b020;
    auVar48 = _DAT_0013b010;
    do {
      auVar53 = auVar48 ^ auVar54;
      if ((bool)(~(auVar42._4_4_ < auVar53._4_4_ ||
                  auVar42._0_4_ < auVar53._0_4_ && auVar53._4_4_ == auVar42._4_4_) & 1)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                           *)local_160._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar24 * 4) = (int)psVar24;
      }
      if (auVar53._12_4_ <= auVar42._12_4_ &&
          (auVar53._8_4_ <= auVar42._8_4_ || auVar53._12_4_ != auVar42._12_4_)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                           *)local_160._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar24 * 4 + 4) = (int)psVar24 + 1;
      }
      psVar24 = (pointer)((long)&psVar24->group + 2);
      lVar7 = auVar48._8_8_;
      auVar48._0_8_ = auVar48._0_8_ + 2;
      auVar48._8_8_ = lVar7 + 2;
    } while (psVar22 != psVar24);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_160);
  time_map_fetch<EasyUseHashMap<HashObject<8,8>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_160,"map_fetch_random");
  if ((vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
       *)local_160._0_8_ !=
      (vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
       *)0x0) {
    operator_delete((void *)local_160._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_160,local_b0,(allocator_type *)local_108);
  auVar54 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar23 = psVar25[-1].bitmap + 5;
    auVar43._8_4_ = (int)puVar23;
    auVar43._0_8_ = puVar23;
    auVar43._12_4_ = (int)((ulong)puVar23 >> 0x20);
    psVar24 = (pointer)0x0;
    auVar43 = auVar43 ^ _DAT_0013b020;
    auVar49 = _DAT_0013b010;
    do {
      auVar53 = auVar49 ^ auVar54;
      if ((bool)(~(auVar43._4_4_ < auVar53._4_4_ ||
                  auVar43._0_4_ < auVar53._0_4_ && auVar53._4_4_ == auVar43._4_4_) & 1)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                           *)local_160._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar24 * 4) = (int)psVar24;
      }
      if (auVar53._12_4_ <= auVar43._12_4_ &&
          (auVar53._8_4_ <= auVar43._8_4_ || auVar53._12_4_ != auVar43._12_4_)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                           *)local_160._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar24 * 4 + 4) = (int)psVar24 + 1;
      }
      psVar24 = (pointer)((long)&psVar24->group + 2);
      lVar7 = auVar49._8_8_;
      auVar49._0_8_ = auVar49._0_8_ + 2;
      auVar49._8_8_ = lVar7 + 2;
    } while (psVar22 != psVar24);
  }
  time_map_fetch<EasyUseHashMap<HashObject<8,8>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_160,"map_fetch_sequential");
  if ((vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
       *)local_160._0_8_ !=
      (vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
       *)0x0) {
    operator_delete((void *)local_160._0_8_);
  }
  local_160._0_8_ = &vStack_130;
  local_160._8_8_ = (pointer)0x1;
  local_150 = (type)0x0;
  tStack_148 = (type)0x0;
  local_140.i_ = 0x3f800000;
  local_138.i_ = 0;
  local_138.buffer_[0] = '\0';
  local_138.buffer_[1] = '\0';
  local_138.buffer_[2] = '\0';
  local_138.buffer_[3] = '\0';
  vStack_130.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  uVar34 = 1;
  if (0 < obj_size) {
    uVar33 = 0;
    do {
      local_108._4_4_ = (uVar33 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar33;
      iVar16 = std::
               _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_160,(key_type *)local_108);
      psVar22 = (pointer)(ulong)(iVar16.
                                 super__Node_iterator_base<std::pair<const_HashObject<8,_8>,_int>,_true>
                                 ._M_cur != (__node_type *)0x0);
      uVar34 = uVar34 ^ iVar16.
                        super__Node_iterator_base<std::pair<const_HashObject<8,_8>,_int>,_true>.
                        _M_cur != (__node_type *)0x0;
      uVar33 = uVar33 + 1;
    } while (obj_size != uVar33);
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar34);
  report("map_fetch_empty",(double)(lVar9 - lVar7),obj_size,start_memory_03,(size_t)psVar22);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_160);
  local_160._0_8_ = &vStack_130;
  local_160._8_8_ = (pointer)0x1;
  local_150 = (type)0x0;
  tStack_148 = (type)0x0;
  local_140.i_ = 0x3f800000;
  local_138.i_ = 0;
  local_138.buffer_[0] = '\0';
  local_138.buffer_[1] = '\0';
  local_138.buffer_[2] = '\0';
  local_138.buffer_[3] = '\0';
  vStack_130.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
  }
  else {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      puVar15 = (uint *)std::__detail::
                        _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
      *puVar15 = uVar34;
    } while (obj_size != uVar34);
    uVar34 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      std::
      _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_160,local_108);
      uVar34 = uVar34 + 1;
    } while (obj_size != uVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_160);
  local_160._0_8_ = &vStack_130;
  local_160._8_8_ = (pointer)0x1;
  local_150 = (type)0x0;
  tStack_148 = (type)0x0;
  local_140.i_ = 0x3f800000;
  local_138.i_ = 0;
  local_138.buffer_[0] = '\0';
  local_138.buffer_[1] = '\0';
  local_138.buffer_[2] = '\0';
  local_138.buffer_[3] = '\0';
  vStack_130.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      puVar15 = (uint *)std::__detail::
                        _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_160,(key_type *)local_108);
      uVar33 = uVar34 + 1;
      *puVar15 = uVar33;
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      std::
      _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_160,(key_type *)local_108);
      uVar34 = uVar33;
    } while (uVar33 != obj_size);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_160);
  local_160._0_8_ = &vStack_130;
  local_160._8_8_ = (pointer)0x1;
  local_150 = (type)0x0;
  tStack_148 = (type)0x0;
  local_140.i_ = 0x3f800000;
  local_138.i_ = 0;
  local_138.buffer_[0] = '\0';
  local_138.buffer_[1] = '\0';
  local_138.buffer_[2] = '\0';
  local_138.buffer_[3] = '\0';
  vStack_130.
  super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      puVar15 = (uint *)std::__detail::
                        _Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
      *puVar15 = uVar34;
    } while (obj_size != uVar34);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  uVar34 = 1;
  for (tVar17 = local_150; tVar17 != (type)0x0; tVar17 = (type)((_Hash_node_base *)tVar17)->_M_nxt)
  {
    uVar34 = uVar34 ^ *(uint *)&((_Hash_node_base *)((long)tVar17 + 0x10))->_M_nxt;
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar34);
  report("map_iterate",(double)(lVar9 - lVar7),obj_size,start_memory_04,(size_t)psVar22);
  std::
  _Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_160);
  putchar(10);
  uVar21 = CONCAT71((int7)((ulong)psVar22 >> 8),1);
  lVar7 = 0;
  do {
    local_c0 = (uint)uVar21;
    uVar26 = (ulong)(int)(&stresshashfunction<EasyUseHashMap<HashObject<8,8>*,int,HashFn>>(int)::
                           kMapSizes)[lVar7];
    local_164 = 1;
    local_98 = uVar26;
    do {
      g_num_copies = 0;
      g_num_hashes = 0;
      std::chrono::_V2::steady_clock::now();
      local_bc = local_a0 / (int)uVar26;
      local_160._0_8_ = &vStack_130;
      local_160._8_8_ = (pointer)0x1;
      local_150 = (type)0x0;
      tStack_148 = (type)0x0;
      local_140.i_ = 0x3f800000;
      local_138.i_ = 0;
      local_138.buffer_[0] = '\0';
      local_138.buffer_[1] = '\0';
      local_138.buffer_[2] = '\0';
      local_138.buffer_[3] = '\0';
      vStack_130.
      super__Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      dVar37 = NAN;
      if (0 < local_bc) {
        iVar35 = 0;
        iVar29 = 0;
        dVar37 = 0.0;
        tVar17 = local_150;
        do {
          while (local_a8 = dVar37, local_b8 = iVar29, tVar17 != (type)0x0) {
            p_Var2 = ((_Hash_node_base *)tVar17)->_M_nxt;
            operator_delete((void *)tVar17);
            iVar29 = local_b8;
            dVar37 = local_a8;
            tVar17 = (type)p_Var2;
          }
          memset((void *)local_160._0_8_,0,local_160._8_8_ << 3);
          local_150 = (type)0x0;
          tStack_148 = (type)0x0;
          std::
          _Hashtable<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::rehash((_Hashtable<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_160,uVar26);
          g_num_copies = 0;
          g_num_hashes = 0;
          local_90 = std::chrono::_V2::steady_clock::now();
          uVar34 = (int)uVar26 >> 0x1f;
          iVar29 = (int)((long)((ulong)uVar34 << 0x20 | uVar26 & 0xffffffff) /
                        (long)(int)(0x7fffffff / (long)(int)local_164));
          if (-1 < iVar29) {
            uVar33 = iVar29 + 1;
            local_88 = (ulong)uVar33;
            local_b4 = (int)((long)((ulong)uVar34 << 0x20 | uVar26 & 0xffffffff) / (long)(int)uVar33
                            );
            uVar26 = 0;
            kVar28 = (key_type)(long)(int)local_164;
            do {
              kVar27 = kVar28;
              iVar29 = local_b4;
              if (0 < local_b4) {
                do {
                  local_108 = (undefined1  [8])kVar27;
                  pmVar18 = std::__detail::
                            _Map_base<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)local_160,(key_type *)local_108);
                  iVar35 = iVar35 + 1;
                  *pmVar18 = iVar35;
                  kVar27 = (key_type)((long)kVar27 + (long)(int)local_164);
                  iVar29 = iVar29 + -1;
                } while (iVar29 != 0);
              }
              uVar26 = uVar26 + 1;
              kVar28 = (key_type)((long)kVar28 + 1);
            } while (uVar26 != local_88);
          }
          lVar7 = std::chrono::_V2::steady_clock::now();
          dVar37 = local_a8 + (double)(lVar7 - local_90);
          iVar29 = local_b8 + 1;
          tVar17 = local_150;
          uVar26 = local_98;
        } while (local_b8 + 1 != local_bc);
        dVar37 = dVar37 / (double)iVar35;
      }
      printf("stresshashfunction map_size=%d stride=%d: %.1fns/insertion\n",dVar37,
             uVar26 & 0xffffffff,(ulong)local_164);
      std::
      _Hashtable<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<HashObject<8,_8>_*,_std::pair<HashObject<8,_8>_*const,_int>,_std::allocator<std::pair<HashObject<8,_8>_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<8,_8>_*>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_160);
      local_164 = local_164 * (int)uVar26;
    } while ((int)local_164 <= (int)uVar26);
    lVar7 = 1;
    uVar21 = 0;
  } while ((local_c0 & 1) != 0);
  psVar22 = psVar25;
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD MAP",8);
  tVar17 = (type)((long)local_160 + 8);
  local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
  local_150 = (type)0x0;
  local_138.i_ = 0;
  local_138.buffer_[0] = '\0';
  local_138.buffer_[1] = '\0';
  local_138.buffer_[2] = '\0';
  local_138.buffer_[3] = '\0';
  g_num_copies = 0;
  g_num_hashes = 0;
  tStack_148 = tVar17;
  local_140 = tVar17;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      puVar15 = (uint *)std::
                        map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                        ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                      *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
      *puVar15 = uVar34;
    } while (obj_size != uVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_160);
  local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
  local_150 = (type)0x0;
  local_138.i_ = 0;
  local_138.buffer_[0] = '\0';
  local_138.buffer_[1] = '\0';
  local_138.buffer_[2] = '\0';
  local_138.buffer_[3] = '\0';
  g_num_copies = 0;
  g_num_hashes = 0;
  tStack_148 = tVar17;
  local_140 = tVar17;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      puVar15 = (uint *)std::
                        map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                        ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                      *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
      *puVar15 = uVar34;
    } while (obj_size != uVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_160);
  local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
  local_150 = (type)0x0;
  local_138.i_ = 0;
  local_138.buffer_[0] = '\0';
  local_138.buffer_[1] = '\0';
  local_138.buffer_[2] = '\0';
  local_138.buffer_[3] = '\0';
  g_num_copies = 0;
  g_num_hashes = 0;
  tStack_148 = tVar17;
  local_140 = tVar17;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
  }
  else {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      puVar15 = (uint *)std::
                        map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                        ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                      *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
      *puVar15 = uVar34;
    } while (obj_size != uVar34);
    uVar34 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      puVar15 = (uint *)std::
                        map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                        ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                      *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
      *puVar15 = uVar34;
    } while (obj_size != uVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_160);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_160,local_b0,(allocator_type *)local_108);
  auVar54 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar23 = psVar25[-1].bitmap + 5;
    auVar44._8_4_ = (int)puVar23;
    auVar44._0_8_ = puVar23;
    auVar44._12_4_ = (int)((ulong)puVar23 >> 0x20);
    psVar24 = (pointer)0x0;
    auVar44 = auVar44 ^ _DAT_0013b020;
    auVar50 = _DAT_0013b010;
    do {
      auVar53 = auVar50 ^ auVar54;
      if ((bool)(~(auVar53._4_4_ == auVar44._4_4_ && auVar44._0_4_ < auVar53._0_4_ ||
                  auVar44._4_4_ < auVar53._4_4_) & 1)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                           *)local_160._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar24 * 4) = (int)psVar24;
      }
      if ((auVar53._12_4_ != auVar44._12_4_ || auVar53._8_4_ <= auVar44._8_4_) &&
          auVar53._12_4_ <= auVar44._12_4_) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                           *)local_160._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar24 * 4 + 4) = (int)psVar24 + 1;
      }
      psVar24 = (pointer)((long)&psVar24->group + 2);
      lVar7 = auVar50._8_8_;
      auVar50._0_8_ = auVar50._0_8_ + 2;
      auVar50._8_8_ = lVar7 + 2;
    } while (psVar22 != psVar24);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_160);
  time_map_fetch<EasyUseMap<HashObject<8,8>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_160,"map_fetch_random");
  if ((vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
       *)local_160._0_8_ !=
      (vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
       *)0x0) {
    operator_delete((void *)local_160._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_160,local_b0,(allocator_type *)local_108);
  auVar54 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar22 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar23 = psVar25[-1].bitmap + 5;
    auVar45._8_4_ = (int)puVar23;
    auVar45._0_8_ = puVar23;
    auVar45._12_4_ = (int)((ulong)puVar23 >> 0x20);
    psVar25 = (pointer)0x0;
    auVar45 = auVar45 ^ _DAT_0013b020;
    auVar51 = _DAT_0013b010;
    do {
      auVar53 = auVar51 ^ auVar54;
      if ((bool)(~(auVar53._4_4_ == auVar45._4_4_ && auVar45._0_4_ < auVar53._0_4_ ||
                  auVar45._4_4_ < auVar53._4_4_) & 1)) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                           *)local_160._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar25 * 4) = (int)psVar25;
      }
      if ((auVar53._12_4_ != auVar45._12_4_ || auVar53._8_4_ <= auVar45._8_4_) &&
          auVar53._12_4_ <= auVar45._12_4_) {
        *(int *)((long)&(((_Vector_base<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
                           *)local_160._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                (long)psVar25 * 4 + 4) = (int)psVar25 + 1;
      }
      psVar25 = (pointer)((long)&psVar25->group + 2);
      lVar7 = auVar51._8_8_;
      auVar51._0_8_ = auVar51._0_8_ + 2;
      auVar51._8_8_ = lVar7 + 2;
    } while (psVar22 != psVar25);
  }
  time_map_fetch<EasyUseMap<HashObject<8,8>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_160,"map_fetch_sequential");
  if ((vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
       *)local_160._0_8_ !=
      (vector<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>_>_>
       *)0x0) {
    operator_delete((void *)local_160._0_8_);
  }
  local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
  local_150.i_ = 0;
  local_150.buffer_[0] = '\0';
  local_150.buffer_[1] = '\0';
  local_150.buffer_[2] = '\0';
  local_150.buffer_[3] = '\0';
  local_138.i_ = 0;
  local_138.buffer_[0] = '\0';
  local_138.buffer_[1] = '\0';
  local_138.buffer_[2] = '\0';
  local_138.buffer_[3] = '\0';
  g_num_copies = 0;
  g_num_hashes = 0;
  tStack_148 = tVar17;
  local_140 = tVar17;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    uVar34 = 1;
  }
  else {
    uVar34 = 1;
    psVar22 = (pointer)0x0;
    do {
      iVar29 = (int)psVar22;
      tVar19 = tVar17;
      tVar32 = tVar17;
      tVar5 = local_150;
      if (local_150 != (type)0x0) {
        do {
          tVar30 = tVar5;
          tVar31 = tVar19;
          iVar35 = *(int *)((long)tVar30 + 0x20);
          tVar19 = tVar30;
          if (iVar35 < iVar29) {
            tVar19 = tVar31;
          }
          tVar5 = *(type *)((undefined1 *)((long)tVar30 + 0x10) + (ulong)(iVar35 < iVar29) * 8);
        } while (*(type *)((undefined1 *)((long)tVar30 + 0x10) + (ulong)(iVar35 < iVar29) * 8) !=
                 (type)0x0);
        if (tVar19 != tVar17) {
          if (iVar35 < iVar29) {
            tVar30 = tVar31;
          }
          tVar32 = tVar19;
          if (iVar29 < *(int *)((long)tVar30 + 0x20)) {
            tVar32 = tVar17;
          }
        }
      }
      uVar34 = uVar34 ^ tVar32 != tVar17;
      psVar22 = (pointer)(ulong)(iVar29 + 1U);
    } while (iVar29 + 1U != obj_size);
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar34);
  report("map_fetch_empty",(double)(lVar9 - lVar7),obj_size,start_memory_05,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_160);
  tVar17 = (type)((long)local_160 + 8);
  local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
  local_150 = (type)0x0;
  local_138.i_ = 0;
  local_138.buffer_[0] = '\0';
  local_138.buffer_[1] = '\0';
  local_138.buffer_[2] = '\0';
  local_138.buffer_[3] = '\0';
  g_num_copies = 0;
  g_num_hashes = 0;
  tStack_148 = tVar17;
  local_140 = tVar17;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
  }
  else {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      puVar15 = (uint *)std::
                        map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                        ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                      *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
      *puVar15 = uVar34;
    } while (obj_size != uVar34);
    uVar34 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      pVar55 = std::
               _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               ::equal_range((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                              *)local_160,(key_type *)local_108);
      std::
      _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
      ::_M_erase_aux((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                      *)local_160,(_Base_ptr)pVar55.first._M_node,(_Base_ptr)pVar55.second._M_node);
      uVar34 = uVar34 + 1;
    } while (obj_size != uVar34);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_160);
  local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
  local_150 = (type)0x0;
  local_138.i_ = 0;
  local_138.buffer_[0] = '\0';
  local_138.buffer_[1] = '\0';
  local_138.buffer_[2] = '\0';
  local_138.buffer_[3] = '\0';
  g_num_copies = 0;
  g_num_hashes = 0;
  tStack_148 = tVar17;
  local_140 = tVar17;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      puVar15 = (uint *)std::
                        map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                        ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                      *)local_160,(key_type *)local_108);
      uVar33 = uVar34 + 1;
      *puVar15 = uVar33;
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      pVar55 = std::
               _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               ::equal_range((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                              *)local_160,(key_type *)local_108);
      std::
      _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
      ::_M_erase_aux((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                      *)local_160,(_Base_ptr)pVar55.first._M_node,(_Base_ptr)pVar55.second._M_node);
      uVar34 = uVar33;
    } while (uVar33 != obj_size);
  }
  auVar54 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar54._0_8_ - lVar7),obj_size,auVar54._8_8_,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_160);
  local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
  local_150 = (type)0x0;
  tVar17 = (type)((long)local_160 + 8);
  local_138.i_ = 0;
  local_138.buffer_[0] = '\0';
  local_138.buffer_[1] = '\0';
  local_138.buffer_[2] = '\0';
  local_138.buffer_[3] = '\0';
  g_num_copies = 0;
  g_num_hashes = 0;
  tStack_148 = tVar17;
  local_140 = tVar17;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar34 = 0;
    do {
      local_108._4_4_ = (uVar34 & 0xff) * 0x1010101;
      local_108._0_4_ = uVar34;
      puVar15 = (uint *)std::
                        map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                        ::operator[]((map<HashObject<8,_8>,_int,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                                      *)local_160,(key_type *)local_108);
      uVar34 = uVar34 + 1;
      *puVar15 = uVar34;
    } while (obj_size != uVar34);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  uVar34 = 1;
  for (tVar19 = tStack_148; tVar19 != tVar17;
      tVar19 = (type)std::_Rb_tree_increment((_Rb_tree_node_base *)tVar19)) {
    uVar34 = uVar34 ^ *(uint *)((long)tVar19 + 0x28);
  }
  lVar9 = std::chrono::_V2::steady_clock::now();
  srand(uVar34);
  report("map_iterate",(double)(lVar9 - lVar7),obj_size,start_memory_06,(size_t)psVar22);
  std::
  _Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<8,_8>,_std::pair<const_HashObject<8,_8>,_int>,_std::_Select1st<std::pair<const_HashObject<8,_8>,_int>_>,_std::less<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
               *)local_160);
  return;
}

Assistant:

static void test_all_maps(int obj_size, int iters) {
  const bool stress_hash_function = obj_size <= 8;

  if (FLAGS_test_sparse_hash_map)
    measure_map<EasyUseSparseHashMap<ObjType, int, HashFn>,
                EasyUseSparseHashMap<ObjType*, int, HashFn>>(
        "SPARSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_dense_hash_map)
    measure_map<EasyUseDenseHashMap<ObjType, int, HashFn>,
                EasyUseDenseHashMap<ObjType*, int, HashFn>>(
        "DENSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_hash_map)
    measure_map<EasyUseHashMap<ObjType, int, HashFn>,
                EasyUseHashMap<ObjType*, int, HashFn>>(
        "STANDARD HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_map)
    measure_map<EasyUseMap<ObjType, int>, EasyUseMap<ObjType*, int>>(
        "STANDARD MAP", obj_size, iters, false);
}